

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O2

void duckdb::InitializeUpdateData<float>
               (UpdateInfo *base_info,Vector *base_data,UpdateInfo *update_info,
               UnifiedVectorFormat *update,SelectionVector *sel)

{
  uint uVar1;
  uint uVar2;
  SelectionVector *pSVar3;
  data_ptr_t pdVar4;
  sel_t *psVar5;
  sel_t *psVar6;
  bool bVar7;
  ulong uVar8;
  ulong uVar9;
  idx_t i_1;
  
  pSVar3 = update->sel;
  pdVar4 = update->data;
  uVar1 = update_info->N;
  uVar2 = update_info->max;
  psVar5 = sel->sel_vector;
  for (uVar8 = 0; uVar8 < uVar1; uVar8 = uVar8 + 1) {
    uVar9 = uVar8;
    if (psVar5 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar5[uVar8];
    }
    psVar6 = pSVar3->sel_vector;
    if (psVar6 != (sel_t *)0x0) {
      uVar9 = (ulong)psVar6[uVar9];
    }
    *(undefined4 *)((long)&update_info[1].segment + uVar8 * 4 + (ulong)uVar2 * 4) =
         *(undefined4 *)(pdVar4 + uVar9 * 4);
  }
  pdVar4 = base_data->data;
  FlatVector::VerifyFlatVector(base_data);
  uVar1 = base_info->max;
  for (uVar8 = 0; uVar8 < base_info->N; uVar8 = uVar8 + 1) {
    uVar9 = (ulong)*(uint *)((long)&base_info[1].segment + uVar8 * 4);
    bVar7 = TemplatedValidityMask<unsigned_long>::RowIsValid
                      (&(base_data->validity).super_TemplatedValidityMask<unsigned_long>,uVar9);
    if (bVar7) {
      *(undefined4 *)((long)&base_info[1].segment + uVar8 * 4 + (ulong)uVar1 * 4) =
           *(undefined4 *)(pdVar4 + uVar9 * 4);
    }
  }
  return;
}

Assistant:

static void InitializeUpdateData(UpdateInfo &base_info, Vector &base_data, UpdateInfo &update_info,
                                 UnifiedVectorFormat &update, const SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto tuple_data = update_info.GetData<T>();

	for (idx_t i = 0; i < update_info.N; i++) {
		auto idx = update.sel->get_index(sel.get_index(i));
		tuple_data[i] = update_data[idx];
	}

	auto base_array_data = FlatVector::GetData<T>(base_data);
	auto &base_validity = FlatVector::Validity(base_data);
	auto base_tuple_data = base_info.GetData<T>();
	auto base_tuples = base_info.GetTuples();
	for (idx_t i = 0; i < base_info.N; i++) {
		auto base_idx = base_tuples[i];
		if (!base_validity.RowIsValid(base_idx)) {
			continue;
		}
		base_tuple_data[i] = UpdateSelectElement::Operation<T>(*base_info.segment, base_array_data[base_idx]);
	}
}